

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWidget_*,_QPersistentModelIndex>::emplace_helper<QPersistentModelIndex>
          (QHash<QWidget_*,_QPersistentModelIndex> *this,QWidget **key,QPersistentModelIndex *args)

{
  QPersistentModelIndexData *pQVar1;
  piter pVar2;
  Node<QWidget_*,_QPersistentModelIndex> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>>::findOrInsert<QWidget*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>> *)this->d,key);
  this_00 = (Node<QWidget_*,_QPersistentModelIndex> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    this_00->key = *key;
    pQVar1 = args->d;
    args->d = (QPersistentModelIndexData *)0x0;
    (this_00->value).d = pQVar1;
  }
  else {
    QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>::emplaceValue<QPersistentModelIndex>
              (this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }